

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O0

void Qentem::Test::TestCopyValue1(QTest *test)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayT *pAVar3;
  Value<char> *pVVar4;
  ObjectT *pOVar5;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  *pHVar6;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar7;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *local_290;
  RealFormatInfo local_288;
  undefined1 local_280 [8];
  VString key_3;
  undefined1 local_268 [4];
  SizeT32 i_3;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_258;
  Value<char> *local_248;
  Array<Qentem::Value<char>_> local_240;
  Array<Qentem::Value<char>_> local_230;
  char *local_220;
  String<char> local_218;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *local_208;
  RealFormatInfo local_200;
  undefined1 local_1f8 [8];
  VString key_2;
  undefined1 local_1e0 [4];
  SizeT32 i_2;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_1d0;
  Value<char> *local_1c0;
  Array<Qentem::Value<char>_> local_1b8;
  Array<Qentem::Value<char>_> local_1a8;
  char *local_198;
  String<char> local_190;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *local_180;
  RealFormatInfo local_178;
  undefined1 local_170 [8];
  VString key_1;
  undefined1 local_158 [4];
  SizeT32 i_1;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_148;
  Value<char> *local_138;
  Array<Qentem::Value<char>_> local_130;
  Array<Qentem::Value<char>_> local_120;
  char *local_110;
  String<char> local_108;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *local_f8;
  RealFormatInfo local_f0;
  undefined1 local_e8 [8];
  VString key;
  undefined1 local_d0 [4];
  SizeT32 i;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_c0;
  Value<char> *local_b0;
  Array<Qentem::Value<char>_> local_a8;
  Array<Qentem::Value<char>_> local_98;
  char *local_88;
  String<char> local_80;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *local_70;
  ObjectItem *h_arr_storage;
  VHArray h_arr_var;
  ValueC *arr_storage;
  VArray arr_var;
  char *c_str_var;
  VString str_var;
  ValueC value1;
  QTest *test_local;
  
  Value<char>::Value((Value<char> *)&str_var.length_);
  String<char>::String((String<char> *)&c_str_var);
  Array<Qentem::Value<char>_>::Array((Array<Qentem::Value<char>_> *)&arr_storage);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,true);
  String<char>::String(&local_80,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=((String<char> *)&c_str_var,&local_80);
  String<char>::~String(&local_80);
  arr_var._8_8_ = String<char>::First((String<char> *)&c_str_var);
  Value<char>::operator=((Value<char> *)&str_var.length_,(StringT *)&c_str_var);
  bVar2 = Value<char>::IsString((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x8cf);
  local_88 = Value<char>::StringStorage((Value<char> *)&str_var.length_);
  QTest::IsNotEqual<char_const*,char_const*>(test,&local_88,(char **)&arr_var.index_,0x8d0);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,true);
  Array<Qentem::Value<char>_>::Array(&local_98,1,false);
  Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)&arr_storage,&local_98);
  Array<Qentem::Value<char>_>::~Array(&local_98);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ArrayT *)&arr_storage);
  bVar2 = Value<char>::IsArray((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x8d9);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pAVar3,0x8da);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  pVVar4 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNull(test,pVVar4,0x8db);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,true);
  memset(&local_a8,0,0x10);
  Array<Qentem::Value<char>_>::Array(&local_a8);
  Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)&arr_storage,&local_a8);
  Array<Qentem::Value<char>_>::~Array(&local_a8);
  Array<Qentem::Value<char>_>::ResizeAndInitialize((Array<Qentem::Value<char>_> *)&arr_storage,3);
  h_arr_var.
  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ._8_8_ = Array<Qentem::Value<char>_>::First((Array<Qentem::Value<char>_> *)&arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ArrayT *)&arr_storage);
  bVar2 = Value<char>::IsArray((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x8e4);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pAVar3,0x8e5);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  pVVar4 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNotNull(test,pVVar4,0x8e6);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  local_b0 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_b0,
             (Value<char> **)
             &h_arr_var.
              super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              .index_,0x8e7);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,true);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HashTable(&local_c0,1);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,&local_c0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_c0);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ObjectT *)&h_arr_storage);
  bVar2 = Value<char>::IsObject((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x8f0);
  pOVar5 = Value<char>::GetObject((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pOVar5,0x8f1);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  pHVar7 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::First(pHVar6);
  QTest::IsNull(test,pHVar7,0x8f2);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,true);
  memset(local_d0,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_d0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,
             (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_d0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_d0);
  for (key._12_4_ = 0; (uint)key._12_4_ < 3; key._12_4_ = key._12_4_ + 1) {
    String<char>::String((String<char> *)local_e8);
    uVar1 = key._12_4_;
    Digit::RealFormatInfo::RealFormatInfo(&local_f0);
    Digit::NumberToString<false,Qentem::String<char>,unsigned_int>
              ((String<char> *)local_e8,uVar1,local_f0);
    uVar1 = key._12_4_;
    pVVar4 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator[]
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,
                        (String<char> *)local_e8);
    Value<char>::operator=(pVVar4,uVar1);
    String<char>::~String((String<char> *)local_e8);
  }
  local_70 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::First((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                      *)&h_arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ObjectT *)&h_arr_storage);
  bVar2 = Value<char>::IsObject((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x902);
  pOVar5 = Value<char>::GetObject((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pOVar5,0x903);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  pHVar7 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::First(pHVar6);
  QTest::IsNotNull(test,pHVar7,0x904);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  local_f8 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::First(pHVar6);
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (test,&local_f8,&local_70,0x905);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,false);
  String<char>::String(&local_108,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=((String<char> *)&c_str_var,&local_108);
  String<char>::~String(&local_108);
  arr_var._8_8_ = String<char>::First((String<char> *)&c_str_var);
  Value<char>::operator=((Value<char> *)&str_var.length_,(StringT *)&c_str_var);
  bVar2 = Value<char>::IsString((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x90f);
  local_110 = Value<char>::StringStorage((Value<char> *)&str_var.length_);
  QTest::IsNotEqual<char_const*,char_const*>(test,&local_110,(char **)&arr_var.index_,0x910);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,false);
  Array<Qentem::Value<char>_>::Array(&local_120,1,false);
  Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)&arr_storage,&local_120);
  Array<Qentem::Value<char>_>::~Array(&local_120);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ArrayT *)&arr_storage);
  bVar2 = Value<char>::IsArray((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x919);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pAVar3,0x91a);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  pVVar4 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNull(test,pVVar4,0x91b);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,false);
  memset(&local_130,0,0x10);
  Array<Qentem::Value<char>_>::Array(&local_130);
  Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)&arr_storage,&local_130);
  Array<Qentem::Value<char>_>::~Array(&local_130);
  Array<Qentem::Value<char>_>::ResizeAndInitialize((Array<Qentem::Value<char>_> *)&arr_storage,3);
  h_arr_var.
  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ._8_8_ = Array<Qentem::Value<char>_>::First((Array<Qentem::Value<char>_> *)&arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ArrayT *)&arr_storage);
  bVar2 = Value<char>::IsArray((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x924);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pAVar3,0x925);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  pVVar4 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNotNull(test,pVVar4,0x926);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  local_138 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_138,
             (Value<char> **)
             &h_arr_var.
              super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              .index_,0x927);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,false);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HashTable(&local_148,1);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,&local_148);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_148);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ObjectT *)&h_arr_storage);
  bVar2 = Value<char>::IsObject((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x930);
  pOVar5 = Value<char>::GetObject((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pOVar5,0x931);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  pHVar7 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::First(pHVar6);
  QTest::IsNull(test,pHVar7,0x932);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,false);
  memset(local_158,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_158);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,
             (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_158);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_158);
  for (key_1._12_4_ = 0; (uint)key_1._12_4_ < 3; key_1._12_4_ = key_1._12_4_ + 1) {
    String<char>::String((String<char> *)local_170);
    uVar1 = key_1._12_4_;
    Digit::RealFormatInfo::RealFormatInfo(&local_178);
    Digit::NumberToString<false,Qentem::String<char>,unsigned_int>
              ((String<char> *)local_170,uVar1,local_178);
    uVar1 = key_1._12_4_;
    pVVar4 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator[]
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,
                        (String<char> *)local_170);
    Value<char>::operator=(pVVar4,uVar1);
    String<char>::~String((String<char> *)local_170);
  }
  local_70 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::First((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                      *)&h_arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ObjectT *)&h_arr_storage);
  bVar2 = Value<char>::IsObject((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x942);
  pOVar5 = Value<char>::GetObject((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pOVar5,0x943);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  pHVar7 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::First(pHVar6);
  QTest::IsNotNull(test,pHVar7,0x944);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  local_180 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              ::First(pHVar6);
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (test,&local_180,&local_70,0x945);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,(NullType)0x0);
  String<char>::String(&local_190,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=((String<char> *)&c_str_var,&local_190);
  String<char>::~String(&local_190);
  arr_var._8_8_ = String<char>::First((String<char> *)&c_str_var);
  Value<char>::operator=((Value<char> *)&str_var.length_,(StringT *)&c_str_var);
  bVar2 = Value<char>::IsString((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x94f);
  local_198 = Value<char>::StringStorage((Value<char> *)&str_var.length_);
  QTest::IsNotEqual<char_const*,char_const*>(test,&local_198,(char **)&arr_var.index_,0x950);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,(NullType)0x0);
  Array<Qentem::Value<char>_>::Array(&local_1a8,1,false);
  Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)&arr_storage,&local_1a8);
  Array<Qentem::Value<char>_>::~Array(&local_1a8);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ArrayT *)&arr_storage);
  bVar2 = Value<char>::IsArray((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x959);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pAVar3,0x95a);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  pVVar4 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNull(test,pVVar4,0x95b);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,(NullType)0x0);
  memset(&local_1b8,0,0x10);
  Array<Qentem::Value<char>_>::Array(&local_1b8);
  Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)&arr_storage,&local_1b8);
  Array<Qentem::Value<char>_>::~Array(&local_1b8);
  Array<Qentem::Value<char>_>::ResizeAndInitialize((Array<Qentem::Value<char>_> *)&arr_storage,3);
  h_arr_var.
  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ._8_8_ = Array<Qentem::Value<char>_>::First((Array<Qentem::Value<char>_> *)&arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ArrayT *)&arr_storage);
  bVar2 = Value<char>::IsArray((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x964);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pAVar3,0x965);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  pVVar4 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNotNull(test,pVVar4,0x966);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  local_1c0 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_1c0,
             (Value<char> **)
             &h_arr_var.
              super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              .index_,0x967);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,(NullType)0x0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HashTable(&local_1d0,1);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,&local_1d0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_1d0);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ObjectT *)&h_arr_storage);
  bVar2 = Value<char>::IsObject((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x970);
  pOVar5 = Value<char>::GetObject((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pOVar5,0x971);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  pHVar7 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::First(pHVar6);
  QTest::IsNull(test,pHVar7,0x972);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,(NullType)0x0);
  memset(local_1e0,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_1e0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,
             (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_1e0);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_1e0);
  for (key_2._12_4_ = 0; (uint)key_2._12_4_ < 3; key_2._12_4_ = key_2._12_4_ + 1) {
    String<char>::String((String<char> *)local_1f8);
    uVar1 = key_2._12_4_;
    Digit::RealFormatInfo::RealFormatInfo(&local_200);
    Digit::NumberToString<false,Qentem::String<char>,unsigned_int>
              ((String<char> *)local_1f8,uVar1,local_200);
    uVar1 = key_2._12_4_;
    pVVar4 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator[]
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,
                        (String<char> *)local_1f8);
    Value<char>::operator=(pVVar4,uVar1);
    String<char>::~String((String<char> *)local_1f8);
  }
  local_70 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::First((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                      *)&h_arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ObjectT *)&h_arr_storage);
  bVar2 = Value<char>::IsObject((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x982);
  pOVar5 = Value<char>::GetObject((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pOVar5,0x983);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  pHVar7 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::First(pHVar6);
  QTest::IsNotNull(test,pHVar7,0x984);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  local_208 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              ::First(pHVar6);
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (test,&local_208,&local_70,0x985);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,0x17);
  String<char>::String(&local_218,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=((String<char> *)&c_str_var,&local_218);
  String<char>::~String(&local_218);
  arr_var._8_8_ = String<char>::First((String<char> *)&c_str_var);
  Value<char>::operator=((Value<char> *)&str_var.length_,(StringT *)&c_str_var);
  bVar2 = Value<char>::IsString((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x98f);
  local_220 = Value<char>::StringStorage((Value<char> *)&str_var.length_);
  QTest::IsNotEqual<char_const*,char_const*>(test,&local_220,(char **)&arr_var.index_,0x990);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,0x21);
  Array<Qentem::Value<char>_>::Array(&local_230,1,false);
  Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)&arr_storage,&local_230);
  Array<Qentem::Value<char>_>::~Array(&local_230);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ArrayT *)&arr_storage);
  bVar2 = Value<char>::IsArray((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x999);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pAVar3,0x99a);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  pVVar4 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNull(test,pVVar4,0x99b);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,0x21);
  memset(&local_240,0,0x10);
  Array<Qentem::Value<char>_>::Array(&local_240);
  Array<Qentem::Value<char>_>::operator=((Array<Qentem::Value<char>_> *)&arr_storage,&local_240);
  Array<Qentem::Value<char>_>::~Array(&local_240);
  Array<Qentem::Value<char>_>::ResizeAndInitialize((Array<Qentem::Value<char>_> *)&arr_storage,3);
  h_arr_var.
  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ._8_8_ = Array<Qentem::Value<char>_>::First((Array<Qentem::Value<char>_> *)&arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ArrayT *)&arr_storage);
  bVar2 = Value<char>::IsArray((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x9a4);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pAVar3,0x9a5);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  pVVar4 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNotNull(test,pVVar4,0x9a6);
  pAVar3 = Value<char>::GetArray((Value<char> *)&str_var.length_);
  local_248 = Array<Qentem::Value<char>_>::First(pAVar3);
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_248,
             (Value<char> **)
             &h_arr_var.
              super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              .index_,0x9a7);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,0x22);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HashTable(&local_258,1);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,&local_258);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_258);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ObjectT *)&h_arr_storage);
  bVar2 = Value<char>::IsObject((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x9b0);
  pOVar5 = Value<char>::GetObject((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pOVar5,0x9b1);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  pHVar7 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::First(pHVar6);
  QTest::IsNull(test,pHVar7,0x9b2);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  Value<char>::operator=((Value<char> *)&str_var.length_,0x22);
  memset(local_268,0,0x10);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_268);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator=
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,
             (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_268);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_268);
  for (key_3._12_4_ = 0; (uint)key_3._12_4_ < 3; key_3._12_4_ = key_3._12_4_ + 1) {
    String<char>::String((String<char> *)local_280);
    uVar1 = key_3._12_4_;
    Digit::RealFormatInfo::RealFormatInfo(&local_288);
    Digit::NumberToString<false,Qentem::String<char>,unsigned_int>
              ((String<char> *)local_280,uVar1,local_288);
    uVar1 = key_3._12_4_;
    pVVar4 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator[]
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage,
                        (String<char> *)local_280);
    Value<char>::operator=(pVVar4,uVar1);
    String<char>::~String((String<char> *)local_280);
  }
  local_70 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::First((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                      *)&h_arr_storage);
  Value<char>::operator=((Value<char> *)&str_var.length_,(ObjectT *)&h_arr_storage);
  bVar2 = Value<char>::IsObject((Value<char> *)&str_var.length_);
  QTest::IsTrue(test,bVar2,0x9c2);
  pOVar5 = Value<char>::GetObject((Value<char> *)&str_var.length_);
  QTest::IsNotNull(test,pOVar5,0x9c3);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  pHVar7 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::First(pHVar6);
  QTest::IsNotNull(test,pHVar7,0x9c4);
  pHVar6 = &Value<char>::GetObject((Value<char> *)&str_var.length_)->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  ;
  local_290 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              ::First(pHVar6);
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (test,&local_290,&local_70,0x9c5);
  Value<char>::Reset((Value<char> *)&str_var.length_);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&h_arr_storage);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&arr_storage);
  String<char>::~String((String<char> *)&c_str_var);
  Value<char>::~Value((Value<char> *)&str_var.length_);
  return;
}

Assistant:

static void TestCopyValue1(QTest &test) {
    ValueC value1;

    // true
    // false
    // null

    VString     str_var;
    const char *c_str_var; // = str_var.First();

    VArray        arr_var;
    const ValueC *arr_storage; // = arr_var.First();

    VHArray           h_arr_var;
    const ObjectItem *h_arr_storage; // = h_arr_var.First();

    ////////////////////////////////////////////

    value1 = true;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = true;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = true;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = true;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = true;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = false;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = false;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = false;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = false;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = false;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = nullptr;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = nullptr;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = nullptr;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = nullptr;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = nullptr;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = 23;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = 33;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = 33;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = 34;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = 34;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////
}